

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::sync_setup(NavierStokesBase *this,MultiFab **DeltaSsync)

{
  int iVar1;
  AdvectionForm *pAVar2;
  void *pvVar3;
  FabFactory<amrex::FArrayBox> *val;
  undefined8 *in_RSI;
  MultiFab *in_RDI;
  int comp;
  int nconserved;
  size_type in_stack_ffffffffffffff58;
  AmrLevel *in_stack_ffffffffffffff60;
  MFInfo *info;
  int in_stack_ffffffffffffff88;
  DistributionMapping *dm;
  undefined4 in_stack_ffffffffffffff98;
  BATType BVar4;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffffb0;
  DistributionMapping local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  int local_18;
  int local_14;
  undefined8 *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  for (local_18 = 3; local_18 < NUM_STATE; local_18 = local_18 + 1) {
    pAVar2 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                       ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (*pAVar2 == Conservative) {
      local_14 = local_14 + 1;
    }
  }
  if (0 < local_14) {
    BVar4 = (in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
    iVar1 = amrex::AmrMesh::finestLevel
                      (*(AmrMesh **)&(in_RDI->super_FabArray<amrex::FArrayBox>).shmem);
    if ((int)BVar4 < iVar1) {
      pvVar3 = operator_new(0x180);
      info = (MFInfo *)
             &(in_RDI->super_FabArray<amrex::FArrayBox>).m_tags.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = 0;
      uStack_30 = 0;
      local_48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_28 = 0;
      dm = &local_48;
      iVar1 = local_14;
      amrex::MFInfo::MFInfo((MFInfo *)0x52d11a);
      val = amrex::AmrLevel::Factory(in_stack_ffffffffffffff60);
      amrex::MultiFab::MultiFab
                (in_RDI,(BoxArray *)CONCAT44(BVar4,in_stack_ffffffffffffff98),dm,iVar1,
                 in_stack_ffffffffffffff88,info,in_stack_ffffffffffffffb0);
      *local_10 = pvVar3;
      amrex::MFInfo::~MFInfo((MFInfo *)0x52d16e);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffff60,(value_type)val);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::sync_setup (MultiFab*& DeltaSsync)
{
    AMREX_ASSERT(DeltaSsync == 0);

    int nconserved = 0;

    for (int comp = AMREX_SPACEDIM; comp < NUM_STATE; ++comp)
    {
        if (advectionType[comp] == Conservative)
            ++nconserved;
    }

    if (nconserved > 0 && level < parent->finestLevel())
    {
        DeltaSsync = new MultiFab(grids, dmap, nconserved, 0, MFInfo(), Factory());
        DeltaSsync->setVal(0);
    }
}